

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O3

unsigned_short
duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<double,unsigned_short>
          (double input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  unsigned_short uVar2;
  duckdb *this;
  double dVar3;
  string local_40;
  
  this = (duckdb *)idx;
  bVar1 = Value::IsFinite<double>(input);
  if (((!bVar1) || (input < 0.0)) || (65536.0 <= input)) {
    CastExceptionText<double,unsigned_short>(&local_40,this,input);
    uVar2 = HandleVectorCastError::Operation<unsigned_short>
                      (&local_40,mask,idx,(VectorTryCastData *)dataptr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  else {
    dVar3 = nearbyint(input);
    uVar2 = (unsigned_short)(int)dVar3;
  }
  return uVar2;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}